

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# size.h
# Opt level: O2

Image<unsigned_short,_gimage::PixelTraits<unsigned_short>_> *
gimage::medianDownscaleImage<unsigned_short>
          (Image<unsigned_short,_gimage::PixelTraits<unsigned_short>_> *__return_storage_ptr__,
          Image<unsigned_short,_gimage::PixelTraits<unsigned_short>_> *image,int factor)

{
  long lVar1;
  long lVar2;
  unsigned_short ***pppuVar3;
  ulong uVar4;
  ulong uVar5;
  ulong uVar6;
  uint uVar7;
  ulong uVar8;
  long lVar9;
  long lVar10;
  long lVar11;
  long k;
  ulong uVar12;
  allocator_type local_81;
  Image<unsigned_short,_gimage::PixelTraits<unsigned_short>_> *local_80;
  value_type_conflict3 local_72;
  ulong local_70;
  long local_68;
  ulong local_60;
  ulong local_58;
  long local_50;
  vector<unsigned_short,_std::allocator<unsigned_short>_> v;
  
  uVar6 = 1;
  if (1 < factor) {
    uVar6 = (ulong)(uint)factor;
  }
  local_80 = __return_storage_ptr__;
  Image<unsigned_short,_gimage::PixelTraits<unsigned_short>_>::Image
            (__return_storage_ptr__,(long)(image->width + (uVar6 - 1)) / (long)uVar6,
             (long)((uVar6 - 1) + image->height) / (long)uVar6,image->depth);
  local_72 = 0;
  std::vector<unsigned_short,_std::allocator<unsigned_short>_>::vector
            (&v,(ulong)(uint)((int)uVar6 * (int)uVar6),&local_72,&local_81);
  local_68 = uVar6 * 2;
  for (lVar10 = 0; lVar10 < image->depth; lVar10 = lVar10 + 1) {
    for (uVar12 = 0; (long)uVar12 < image->height; uVar12 = uVar12 + uVar6) {
      lVar11 = 0;
      lVar9 = 0;
      uVar4 = 0;
      while (lVar1 = image->width, (long)uVar4 < lVar1) {
        lVar2 = image->height;
        uVar8 = 0;
        for (uVar5 = 0; (uVar7 = (uint)uVar8, uVar5 != uVar6 && ((long)(uVar12 + uVar5) < lVar2));
            uVar5 = uVar5 + 1) {
          pppuVar3 = image->img;
          for (uVar8 = 0; (uVar6 != uVar8 && (lVar1 + lVar9 != uVar8)); uVar8 = uVar8 + 1) {
            v.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
            super__Vector_impl_data._M_start[(long)(int)uVar7 + uVar8] =
                 *(unsigned_short *)((long)pppuVar3[lVar10][uVar12 + uVar5] + uVar8 * 2 + lVar11);
          }
          uVar8 = (ulong)(uVar7 + (int)uVar8);
        }
        local_80->img[lVar10][uVar12 / uVar6][uVar4 / uVar6] = 0;
        local_70 = uVar4;
        if (0 < (int)uVar7) {
          local_60 = uVar12 / uVar6;
          local_58 = uVar4 / uVar6;
          local_50 = lVar9;
          std::
          __partial_sort<__gnu_cxx::__normal_iterator<unsigned_short*,std::vector<unsigned_short,std::allocator<unsigned_short>>>,__gnu_cxx::__ops::_Iter_less_iter>
                    (v.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
                     super__Vector_impl_data._M_start,
                     (ulong)(uVar7 & 0xfffffffe) +
                     (long)v.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>.
                           _M_impl.super__Vector_impl_data._M_start,
                     v.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
                     super__Vector_impl_data._M_start + uVar8);
          local_80->img[lVar10][local_60][local_58] =
               v.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
               super__Vector_impl_data._M_start[uVar7 >> 1];
          lVar9 = local_50;
        }
        lVar9 = lVar9 - uVar6;
        lVar11 = lVar11 + local_68;
        uVar4 = local_70 + uVar6;
      }
    }
  }
  std::_Vector_base<unsigned_short,_std::allocator<unsigned_short>_>::~_Vector_base
            (&v.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>);
  return local_80;
}

Assistant:

Image<T> medianDownscaleImage(const Image<T> &image, int factor)
{
  factor=std::max(1, factor);

  Image<T> ret((image.getWidth()+factor-1)/factor,
               (image.getHeight()+factor-1)/factor, image.getDepth());

  std::vector<T> v(factor*factor, 0);

  for (int d=0; d<image.getDepth(); d++)
  {
    for (long k=0; k<image.getHeight(); k+=factor)
    {
      for (long i=0; i<image.getWidth(); i+=factor)
      {
        int n=0;

        for (int kk=0; kk<factor && k+kk<image.getHeight(); kk++)
        {
          for (int ii=0; ii<factor && i+ii<image.getWidth(); ii++)
          {
            if (image.isValid(i+ii, k+kk))
            {
              v[n]=image.get(i+ii, k+kk, d);
              n++;
            }
          }
        }

        ret.setInvalid(i/factor, k/factor, d);

        if (n > 0)
        {
          partial_sort(v.begin(), v.begin()+(n>>1), v.begin()+n);
          ret.set(i/factor, k/factor, d, v[n>>1]);
        }
      }
    }
  }

  return ret;
}